

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::addVec
          (HighsSparseMatrix *this,HighsInt num_nz,HighsInt *index,double *value,double multiple)

{
  bool bVar1;
  int in_ESI;
  HighsSparseMatrix *in_RDI;
  HighsInt iEl;
  HighsInt num_vec;
  value_type_conflict1 *in_stack_ffffffffffffffa8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_30;
  int local_2c;
  
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    local_2c = in_RDI->num_col_;
  }
  else {
    local_2c = in_RDI->num_row_;
  }
  for (local_30 = 0; local_30 < in_ESI; local_30 = local_30 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (value_type_conflict2 *)in_RDI);
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  this_00 = &in_RDI->start_;
  std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_2c);
  std::vector<int,_std::allocator<int>_>::push_back
            (this_00,(value_type_conflict2 *)in_stack_ffffffffffffffa8);
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    in_RDI->num_col_ = in_RDI->num_col_ + 1;
  }
  else {
    in_RDI->num_row_ = in_RDI->num_row_ + 1;
  }
  return;
}

Assistant:

void HighsSparseMatrix::addVec(const HighsInt num_nz, const HighsInt* index,
                               const double* value, const double multiple) {
  HighsInt num_vec = 0;
  if (this->isColwise()) {
    num_vec = this->num_col_;
  } else {
    num_vec = this->num_row_;
  }
  assert((int)this->start_.size() == num_vec + 1);
  assert((int)this->index_.size() == this->numNz());
  assert((int)this->value_.size() == this->numNz());
  for (HighsInt iEl = 0; iEl < num_nz; iEl++) {
    this->index_.push_back(index[iEl]);
    this->value_.push_back(multiple * value[iEl]);
  }
  this->start_.push_back(this->start_[num_vec] + num_nz);
  if (this->isColwise()) {
    this->num_col_++;
  } else {
    this->num_row_++;
  }
}